

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crawler.cpp
# Opt level: O2

void __thiscall Crawler::genNewId(Crawler *this)

{
  bdNodeId *id;
  FILE *__stream;
  string stringID;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->crwlrMutex);
  id = (bdNodeId *)operator_new(0x14);
  id->data[0] = '\0';
  id->data[1] = '\0';
  id->data[2] = '\0';
  id->data[3] = '\0';
  id->data[4] = '\0';
  id->data[5] = '\0';
  id->data[6] = '\0';
  id->data[7] = '\0';
  id->data[8] = '\0';
  id->data[9] = '\0';
  id->data[10] = '\0';
  id->data[0xb] = '\0';
  id->data[0xc] = '\0';
  id->data[0xd] = '\0';
  id->data[0xe] = '\0';
  id->data[0xf] = '\0';
  id->data[0x10] = '\0';
  id->data[0x11] = '\0';
  id->data[0x12] = '\0';
  id->data[0x13] = '\0';
  this->peerId = id;
  bdStdRandomNodeId(id);
  std::operator<<((ostream *)&std::cerr,"Starting with ownID: ");
  bdStdPrintNodeId((ostream *)&std::cerr,this->peerId);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  __stream = fopen("my_ids","a+");
  stringID._M_dataplus._M_p = (pointer)&stringID.field_2;
  stringID._M_string_length = 0;
  stringID.field_2._M_local_buf[0] = '\0';
  bdStdPrintNodeId(&stringID,this->peerId,false);
  fprintf(__stream,"%s\n",stringID._M_dataplus._M_p);
  fclose(__stream);
  std::__cxx11::string::~string((string *)&stringID);
  pthread_mutex_unlock((pthread_mutex_t *)&this->crwlrMutex);
  return;
}

Assistant:

void Crawler::genNewId() {
    bdStackMutex stack(crwlrMutex); /********** MUTEX LOCKED *************/
    peerId = new bdNodeId();
    bdStdRandomNodeId(peerId);
    std::cerr << "Starting with ownID: ";
    bdStdPrintNodeId(std::cerr, peerId);
    std::cerr << std::endl;
    FILE *myIDs = fopen(USED_IDS_FILENAME, "a+");
    std::string stringID;
    bdStdPrintNodeId(stringID, peerId, false);
    fprintf(myIDs, "%s\n", stringID.c_str());
    fclose(myIDs);
}